

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall GT5VolumeFile::parseHeader(GT5VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  pointer puVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  uint32_t seed;
  GT5VolumeFile *this_00;
  uint uVar7;
  uint uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char titleId [128];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  if ((this->super_VolumeFile).m_swapEndian == true) {
    if (*(int *)header != 0x6251745b) {
      return false;
    }
    seed = swap_bytes(*(undefined4 *)(header + 4));
    uVar7 = swap_bytes(*(undefined4 *)(header + 8));
    uVar8 = swap_bytes(*(undefined4 *)(header + 0xc));
  }
  else {
    if (*(int *)header != 0x5b745162) {
      return false;
    }
    seed = *(uint32_t *)(header + 4);
    uVar7 = *(uint *)(header + 8);
    uVar8 = *(uint *)(header + 0xc);
  }
  local_a8 = *(undefined8 *)(header + 0x20);
  uStack_a0 = *(undefined8 *)(header + 0x28);
  uStack_98 = *(undefined8 *)(header + 0x30);
  uStack_90 = *(undefined8 *)(header + 0x38);
  uStack_88 = *(undefined8 *)(header + 0x40);
  uStack_80 = *(undefined8 *)(header + 0x48);
  uStack_78 = *(undefined8 *)(header + 0x50);
  uStack_70 = *(undefined8 *)(header + 0x58);
  local_68 = *(undefined8 *)(header + 0x60);
  uStack_60 = *(undefined8 *)(header + 0x68);
  uStack_58 = *(undefined8 *)(header + 0x70);
  uStack_50 = *(undefined8 *)(header + 0x78);
  uStack_48 = *(undefined8 *)(header + 0x80);
  uStack_40 = *(undefined8 *)(header + 0x88);
  uStack_38 = *(undefined8 *)(header + 0x90);
  uStack_30 = *(undefined8 *)(header + 0x98);
  std::__cxx11::string::assign((char *)&this->m_titleId);
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar5 = VolumeFile::readDataAt
                    (&this->super_VolumeFile,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,0x800,
                     (ulong)uVar7);
  if (bVar5) {
    this_00 = this;
    VolumeFile::decryptData
              (&this->super_VolumeFile,local_1a8._M_impl.super__Vector_impl_data._M_start,
               (long)local_1a8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a8._M_impl.super__Vector_impl_data._M_start,seed);
    bVar5 = VolumeFile::inflateDataIfNeeded
                      (&this_00->super_VolumeFile,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,
                       (ulong)uVar8);
    if (bVar5) {
      (this->super_VolumeFile).m_dataOffset = (ulong)uVar7 + 0xfff & 0xfffffffffffff800;
      puVar1 = (this->super_VolumeFile).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar3 = (this->super_VolumeFile).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->super_VolumeFile).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->super_VolumeFile).m_data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1a8._M_impl.super__Vector_impl_data._M_start;
      (this->super_VolumeFile).m_data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = local_1a8._M_impl.super__Vector_impl_data._M_finish;
      (this->super_VolumeFile).m_data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1a8._M_impl.super__Vector_impl_data._M_start = puVar3;
      local_1a8._M_impl.super__Vector_impl_data._M_finish = puVar4;
      local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
      std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::emplace_back<>
                (&(this->super_VolumeFile).m_dataStreams);
      pSVar2 = (this->super_VolumeFile).m_dataStreams.
               super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_assign((string *)&pSVar2[-1].filePath);
      bVar5 = prepareStream(&pSVar2[-1].stream,&pSVar2[-1].filePath,&pSVar2[-1].fileSize);
      if (bVar5) {
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (&local_188,"Data file size: %1%");
        f = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long&>
                      (&local_188,&pSVar2[-1].fileSize);
        pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,f);
        std::endl<char,std::char_traits<char>>(pbVar6);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                  (&local_188);
        bVar5 = true;
        goto LAB_0011c4d3;
      }
    }
  }
  bVar5 = false;
LAB_0011c4d3:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
  return bVar5;
}

Assistant:

bool GT5VolumeFile::parseHeader(const uint8_t* header, uint64_t headerSize)
{
	const auto* p = header;

	const auto headerSizeAligned = SEGMENT_SIZE;

	const auto magic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (magic != HEADER_MAGIC) {
		return false;
	}

	const auto seed = VOLUME_READ_NEXT_SELF(p, uint32_t); // TODO: segment index actually?
	const auto zDataSize = VOLUME_READ_NEXT_SELF(p, uint32_t); // with header
	const auto dataSize = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto unk = VOLUME_READ_NEXT_SELF(p, uint64_t);
	const auto fileSize = VOLUME_READ_NEXT_SELF(p, uint64_t);
	UNUSED(fileSize);

	char titleId[128];
	VOLUME_READN_NEXT_SELF(p, char, titleId, sizeof(titleId));
	m_titleId = titleId;

	std::vector<uint8_t> data;
	if (!readDataAt(data, headerSizeAligned, zDataSize)) {
		return false;
	}
	decryptData(data.data(), data.size(), seed);
	if (!inflateDataIfNeeded(data, dataSize)) {
		return false;
	}

	m_dataOffset = alignUp(headerSizeAligned + zDataSize, SEGMENT_SIZE);
	m_data.swap(data);

	m_dataStreams.emplace_back();
	auto& streamDesc = m_dataStreams.back();
	{
		streamDesc.filePath = m_origPath.string();
		if (!prepareStream(streamDesc.stream, streamDesc.filePath, &streamDesc.fileSize)) {
			return false;
		}
		std::cout << boost::format("Data file size: %1%") % streamDesc.fileSize << std::endl;
	}

	return true;
}